

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_node __thiscall pugi::xpath_query::evaluate_node(xpath_query *this,xpath_node *n)

{
  xpath_ast_node *this_00;
  xpath_node_set_raw r;
  xpath_context c;
  xpath_stack_data sd;
  xpath_node local_20c8;
  xpath_node_set_raw local_20b8;
  xpath_context local_2098;
  xpath_memory_block local_2070;
  xpath_memory_block local_1060;
  xpath_allocator local_50;
  xpath_allocator local_38;
  xpath_stack local_20;
  bool local_10 [8];
  
  if (((undefined8 *)this->_impl == (undefined8 *)0x0) ||
     (this_00 = *this->_impl, this_00->_rettype != '\x01')) {
    xpath_node::xpath_node(&local_20c8);
  }
  else {
    local_2098.n._node._root = (n->_node)._root;
    local_2098.n._attribute._attr = (n->_attribute)._attr;
    local_2098.position = 1;
    local_2098.size = 1;
    local_20.result = &local_50;
    local_50._error = local_10;
    local_50._root = &local_2070;
    local_50._root_size = 0;
    local_20.temp = &local_38;
    local_38._root = &local_1060;
    local_38._root_size = 0;
    local_10[0] = false;
    local_1060.next = (xpath_memory_block *)0x0;
    local_2070.next = (xpath_memory_block *)0x0;
    local_1060.capacity = 0x1000;
    local_2070.capacity = 0x1000;
    local_38._error = local_50._error;
    impl::anon_unknown_0::xpath_ast_node::eval_node_set
              (&local_20b8,this_00,&local_2098,&local_20,nodeset_eval_first);
    if (local_10[0] == true) {
      xpath_node::xpath_node(&local_20c8);
    }
    else {
      local_20c8 = impl::anon_unknown_0::xpath_first
                             (local_20b8._begin,local_20b8._end,local_20b8._type);
    }
    impl::anon_unknown_0::xpath_allocator::release((xpath_allocator *)local_50._root);
    impl::anon_unknown_0::xpath_allocator::release((xpath_allocator *)local_38._root);
  }
  return local_20c8;
}

Assistant:

PUGI_IMPL_FN xpath_node xpath_query::evaluate_node(const xpath_node& n) const
	{
		impl::xpath_ast_node* root = impl::evaluate_node_set_prepare(static_cast<impl::xpath_query_impl*>(_impl));
		if (!root) return xpath_node();

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		impl::xpath_node_set_raw r = root->eval_node_set(c, sd.stack, impl::nodeset_eval_first);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return xpath_node();
		#else
			throw std::bad_alloc();
		#endif
		}

		return r.first();
	}